

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server::readent(entity *e,char *buf,int ver)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  ushort uVar4;
  
  if (ver < 0x1f) {
    bVar2 = e->type;
    if ((bVar2 < 0x1f) && ((0x7e300000U >> (bVar2 & 0x1f) & 1) != 0)) {
      e->attr1 = (short)((long)(e->attr1 + 0xb4) % 0x168);
    }
  }
  else {
    if (ver != 0x1f) {
      return;
    }
    bVar2 = e->type;
  }
  if ((byte)(bVar2 - 0x1a) < 4) {
    uVar4 = e->attr1 % 0x168;
    uVar1 = uVar4 + 0x168 & 0xffff;
    uVar3 = uVar1 - 0x168;
    if (0xfe97 < uVar4) {
      uVar3 = uVar1;
    }
    e->attr1 = (short)(uVar3 + 7) - (short)((ulong)(uVar3 + 7) % 0xf);
  }
  return;
}

Assistant:

void readent(entity &e, char *buf, int ver) //read from disk, and init
    {
        if(ver <= 30) switch(e.type)
        {
            case FLAG:
            case MONSTER:
            case TELEDEST:
            case RESPAWNPOINT:
            case BOX:
            case BARREL:
            case PLATFORM:
            case ELEVATOR:
                e.attr1 = (int(e.attr1)+180)%360;
                break;
        }
        if(ver <= 31) switch(e.type)
        {
            case BOX:
            case BARREL:
            case PLATFORM:
            case ELEVATOR:
                int yaw = (int(e.attr1)%360 + 360)%360 + 7;
                e.attr1 = yaw - yaw%15;
                break;
        }
    }